

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetShadingRate
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,SHADING_RATE BaseRate,
          SHADING_RATE_COMBINER PrimitiveCombiner,SHADING_RATE_COMBINER TextureCombiner,int param_4)

{
  String *__return_storage_ptr__;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  SHADING_RATE_COMBINER SVar3;
  SHADING_RATE_CAP_FLAGS SVar4;
  SHADING_RATE_CAP_FLAGS SVar5;
  Char *pCVar6;
  RenderDeviceVkImpl *pRVar7;
  RenderDeviceInfo *pRVar8;
  GraphicsAdapterInfo *pGVar9;
  COMMAND_QUEUE_TYPE Type;
  char (*in_R9) [8];
  byte local_241;
  undefined1 local_1d8 [8];
  string msg_11;
  Uint32 i;
  bool IsSupported;
  string msg_10;
  string msg_9;
  string msg_8;
  string msg_7;
  string msg_6;
  ShadingRateProperties *SRProps;
  string msg_5;
  string msg_4;
  string msg_3;
  undefined1 local_88 [8];
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  int param_4_local;
  SHADING_RATE_COMBINER TextureCombiner_local;
  SHADING_RATE_COMBINER PrimitiveCombiner_local;
  SHADING_RATE BaseRate_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_4_ = param_4;
  msg.field_2._M_local_buf[0xd] = TextureCombiner;
  msg.field_2._M_local_buf[0xe] = PrimitiveCombiner;
  msg.field_2._M_local_buf[0xf] = BaseRate;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_38,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x84e);
      std::__cxx11::string::~string((string *)local_38);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x84e);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar2 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[15],char[22],std::__cxx11::string,char[8]>
              ((string *)local_88,(Diligent *)"SetShadingRate",(char (*) [15])0xcc2999,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x84e);
    std::__cxx11::string::~string((string *)local_88);
  }
  bVar1 = IsPowerOfTwo<Diligent::SHADING_RATE_COMBINER>(msg.field_2._M_local_buf[0xe]);
  if (!bVar1) {
    FormatString<char[46]>
              ((string *)((long)&msg_4.field_2 + 8),
               (char (*) [46])"Only one primitive combiner must be specified");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x850);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  bVar1 = IsPowerOfTwo<Diligent::SHADING_RATE_COMBINER>(msg.field_2._M_local_buf[0xd]);
  if (!bVar1) {
    FormatString<char[44]>
              ((string *)((long)&msg_5.field_2 + 8),
               (char (*) [44])"Only one texture combiner must be specified");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x851);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  pRVar7 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
  pRVar8 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetDeviceInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar7);
  if ((pRVar8->Features).VariableRateShading == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[76]>
              ((string *)&SRProps,
               (char (*) [76])
               "IDeviceContext::SetShadingRate: VariableRateShading feature must be enabled");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x852);
    std::__cxx11::string::~string((string *)&SRProps);
  }
  pRVar7 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
  pGVar9 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar7);
  SVar5 = (pGVar9->ShadingRate).CapFlags;
  SVar4 = Diligent::operator|(SHADING_RATE_CAP_FLAG_PER_DRAW,SHADING_RATE_CAP_FLAG_PER_PRIMITIVE);
  SVar4 = Diligent::operator|(SVar4,SHADING_RATE_CAP_FLAG_TEXTURE_BASED);
  SVar5 = Diligent::operator&(SVar5,SVar4);
  if (SVar5 == SHADING_RATE_CAP_FLAG_NONE) {
    FormatString<char[184]>
              ((string *)((long)&msg_7.field_2 + 8),
               (char (*) [184])
               "IDeviceContext::SetShadingRate: requires one of the following capabilities: SHADING_RATE_CAP_FLAG_PER_DRAW, SHADING_RATE_CAP_FLAG_PER_PRIMITIVE, or SHADING_RATE_CAP_FLAG_TEXTURE_BASED"
              );
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x857);
    std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
  }
  SVar5 = Diligent::operator&((pGVar9->ShadingRate).CapFlags,SHADING_RATE_CAP_FLAG_PER_PRIMITIVE);
  if (SVar5 == SHADING_RATE_CAP_FLAG_NONE) {
    if (msg.field_2._M_local_buf[0xe] != '\x01') {
      FormatString<char[114]>
                ((string *)((long)&msg_9.field_2 + 8),
                 (char (*) [114])
                 "IDeviceContext::SetShadingRate: PrimitiveCombiner must be PASSTHROUGH when per primitive shading is not supported"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x85b);
      std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
    }
  }
  else {
    SVar3 = Diligent::operator&((pGVar9->ShadingRate).Combiners,msg.field_2._M_local_buf[0xe]);
    if (SVar3 == 0) {
      FormatString<char[89]>
                ((string *)((long)&msg_8.field_2 + 8),
                 (char (*) [89])
                 "IDeviceContext::SetShadingRate: PrimitiveCombiner must be one of the supported combiners"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x859);
      std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
    }
  }
  SVar5 = Diligent::operator&((pGVar9->ShadingRate).CapFlags,SHADING_RATE_CAP_FLAG_TEXTURE_BASED);
  if (SVar5 == SHADING_RATE_CAP_FLAG_NONE) {
    if (msg.field_2._M_local_buf[0xd] != '\x01') {
      FormatString<char[112]>
                ((string *)&i,
                 (char (*) [112])
                 "IDeviceContext::SetShadingRate: TextureCombiner must be PASSTHROUGH when texture based shading is not supported"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x860);
      std::__cxx11::string::~string((string *)&i);
    }
  }
  else {
    SVar3 = Diligent::operator&((pGVar9->ShadingRate).Combiners,msg.field_2._M_local_buf[0xd]);
    if (SVar3 == 0) {
      FormatString<char[87]>
                ((string *)((long)&msg_10.field_2 + 8),
                 (char (*) [87])
                 "IDeviceContext::SetShadingRate: TextureCombiner must be one of the supported combiners"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x85e);
      std::__cxx11::string::~string((string *)(msg_10.field_2._M_local_buf + 8));
    }
  }
  msg_11.field_2._M_local_buf[0xf] = '\0';
  msg_11.field_2._8_4_ = 0;
  while( true ) {
    local_241 = 0;
    if ((uint)msg_11.field_2._8_4_ < (uint)(pGVar9->ShadingRate).NumShadingRates) {
      local_241 = msg_11.field_2._M_local_buf[0xf] ^ 0xff;
    }
    if ((local_241 & 1) == 0) break;
    msg_11.field_2._M_local_buf[0xf] =
         (pGVar9->ShadingRate).ShadingRates[(uint)msg_11.field_2._8_4_].Rate ==
         msg.field_2._M_local_buf[0xf];
    msg_11.field_2._8_4_ = msg_11.field_2._8_4_ + 1;
  }
  if (msg_11.field_2._M_local_buf[0xf] == '\0') {
    FormatString<char[84]>
              ((string *)local_1d8,
               (char (*) [84])
               "IDeviceContext::SetShadingRate: BaseRate must be one of the supported shading rates"
              );
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x867);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::SetShadingRate(SHADING_RATE BaseRate, SHADING_RATE_COMBINER PrimitiveCombiner, SHADING_RATE_COMBINER TextureCombiner, int) const
{
#ifdef DILIGENT_DEVELOPMENT
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetShadingRate");

    DEV_CHECK_ERR(IsPowerOfTwo(PrimitiveCombiner), "Only one primitive combiner must be specified");
    DEV_CHECK_ERR(IsPowerOfTwo(TextureCombiner), "Only one texture combiner must be specified");
    DEV_CHECK_ERR(m_pDevice->GetDeviceInfo().Features.VariableRateShading, "IDeviceContext::SetShadingRate: VariableRateShading feature must be enabled");

    const ShadingRateProperties& SRProps = m_pDevice->GetAdapterInfo().ShadingRate;
    DEV_CHECK_ERR(SRProps.CapFlags & (SHADING_RATE_CAP_FLAG_PER_DRAW | SHADING_RATE_CAP_FLAG_PER_PRIMITIVE | SHADING_RATE_CAP_FLAG_TEXTURE_BASED),
                  "IDeviceContext::SetShadingRate: requires one of the following capabilities: SHADING_RATE_CAP_FLAG_PER_DRAW, "
                  "SHADING_RATE_CAP_FLAG_PER_PRIMITIVE, or SHADING_RATE_CAP_FLAG_TEXTURE_BASED");
    if (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_PER_PRIMITIVE)
        DEV_CHECK_ERR(SRProps.Combiners & PrimitiveCombiner, "IDeviceContext::SetShadingRate: PrimitiveCombiner must be one of the supported combiners");
    else
        DEV_CHECK_ERR(PrimitiveCombiner == SHADING_RATE_COMBINER_PASSTHROUGH, "IDeviceContext::SetShadingRate: PrimitiveCombiner must be PASSTHROUGH when per primitive shading is not supported");

    if (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED)
        DEV_CHECK_ERR(SRProps.Combiners & TextureCombiner, "IDeviceContext::SetShadingRate: TextureCombiner must be one of the supported combiners");
    else
        DEV_CHECK_ERR(TextureCombiner == SHADING_RATE_COMBINER_PASSTHROUGH, "IDeviceContext::SetShadingRate: TextureCombiner must be PASSTHROUGH when texture based shading is not supported");

    bool IsSupported = false;
    for (Uint32 i = 0; i < SRProps.NumShadingRates && !IsSupported; ++i)
    {
        IsSupported = (SRProps.ShadingRates[i].Rate == BaseRate);
    }
    DEV_CHECK_ERR(IsSupported, "IDeviceContext::SetShadingRate: BaseRate must be one of the supported shading rates");
#endif
}